

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void SequentializeParallelCopies(ExpressionContext *ctx,VmModule *module,VmFunction *function)

{
  VmBlock *local_30;
  VmInstruction *inst;
  VmBlock *block;
  VmFunction *function_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  for (inst = (VmInstruction *)function->firstBlock; inst != (VmInstruction *)0x0;
      inst = (VmInstruction *)(inst->arguments).little[2]) {
    for (local_30 = (VmBlock *)(inst->arguments).little[3]; local_30 != (VmBlock *)0x0;
        local_30 = (VmBlock *)(local_30->predecessors).data) {
      if (*(VmInstructionType *)&(local_30->name).begin == VM_INST_PARALLEL_COPY) {
        module->currentBlock = (VmBlock *)inst;
        inst->parent = local_30;
        SequentializeParallelCopy(module,(VmInstruction *)local_30);
        module->currentBlock = (VmBlock *)0x0;
        inst->parent = (VmBlock *)(inst->arguments).allocator;
      }
    }
    RunDeadCodeElimiation(ctx,module,(VmBlock *)inst);
  }
  return;
}

Assistant:

void SequentializeParallelCopies(ExpressionContext &ctx, VmModule *module, VmFunction* function)
{
	for(VmBlock *block = function->firstBlock; block; block = block->nextSibling)
	{
		for(VmInstruction *inst = block->firstInstruction; inst; inst = inst->nextSibling)
		{
			if(inst->cmd == VM_INST_PARALLEL_COPY)
			{
				module->currentBlock = block;
				block->insertPoint = inst;

				SequentializeParallelCopy(module, inst);

				module->currentBlock = NULL;
				block->insertPoint = block->lastInstruction;
			}
		}

		RunDeadCodeElimiation(ctx, module, block);
	}
}